

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_witness_program_from_bytes_and_version
              (uchar *bytes,size_t bytes_len,uint32_t version,uint32_t flags,uchar *bytes_out,
              size_t len,size_t *written)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  uchar *p;
  int ret;
  size_t v1plus_max_size;
  size_t len_local;
  uchar *bytes_out_local;
  uint32_t flags_local;
  uint32_t version_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (((((bytes_len == 0) || (bytes != (uchar *)0x0)) && (version < 0x11)) &&
      ((_Var1 = script_flags_ok(flags,4), _Var1 && (bytes_out != (uchar *)0x0)))) &&
     ((len != 0 && (written != (size_t *)0x0)))) {
    if ((flags & 3) == 0) {
      if (((version == 0) && (bytes_len != 0x14)) && (bytes_len != 0x20)) {
        return -2;
      }
      if ((bytes_len < 2) || (0x28 < bytes_len)) {
        return -2;
      }
    }
    else if (bytes_len == 0) {
      return -2;
    }
    v1plus_max_size = len;
    len_local = (size_t)bytes_out;
    if ((flags & 4) != 0) {
      if (len < 2) {
        return -2;
      }
      len_local = (size_t)(bytes_out + 1);
      v1plus_max_size = len - 1;
    }
    sVar3 = value_to_op_n((ulong)version);
    *(char *)len_local = (char)sVar3;
    iVar2 = wally_script_push_from_bytes
                      (bytes,bytes_len,flags & 0xfffffffb,(uchar *)(len_local + 1),
                       v1plus_max_size - 1,written);
    if ((iVar2 == 0) && (*written = *written + 1, (flags & 4) != 0)) {
      *bytes_out = (uchar)*written;
      *written = *written + 1;
    }
    return iVar2;
  }
  return -2;
}

Assistant:

int wally_witness_program_from_bytes_and_version(const unsigned char *bytes, size_t bytes_len,
                                                 uint32_t version, uint32_t flags,
                                                 unsigned char *bytes_out, size_t len,
                                                 size_t *written)
{
    /* v1+ max size: 40 data bytes, 1 byte version plus 1 byte push opcode */
    const size_t v1plus_max_size = WALLY_WITNESSSCRIPT_MAX_LEN - 2;
    int ret;
    unsigned char *p = bytes_out;

    if (written)
        *written = 0;

    if ((bytes_len && !bytes) || version > 16u ||
        !script_flags_ok(flags, WALLY_SCRIPT_AS_PUSH) ||
        !bytes_out || !len || !written)
        return WALLY_EINVAL;

    if (flags & ALL_SCRIPT_HASH_FLAGS) {
        if (!bytes_len)
            return WALLY_EINVAL;
    } else if (version == 0 && bytes_len != HASH160_LEN && bytes_len != SHA256_LEN) {
        return WALLY_EINVAL; /* Invalid length for v0 witness script */
    } else if (bytes_len < 2 || bytes_len > v1plus_max_size) {
        return WALLY_EINVAL; /* Invalid length for v1+ witness scripts */
    }
    if (flags & WALLY_SCRIPT_AS_PUSH) {
        if (len < 2)
            return WALLY_EINVAL;
        ++bytes_out;
        --len;
    }

    /* Witness version, OP_0 or OP_1 - OP_16 */
    bytes_out[0] = value_to_op_n(version);
    ret = wally_script_push_from_bytes(bytes, bytes_len,
                                       flags & ~WALLY_SCRIPT_AS_PUSH,
                                       bytes_out + 1, len - 1, written);
    if (ret == WALLY_OK) {
        *written += 1; /* For Witness version byte */
        if (flags & WALLY_SCRIPT_AS_PUSH) {
            *p = *written & 0xff;
            *written += 1; /* For Witness version byte */
        }
    }
    return ret;
}